

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

void ImGuiStb::stb_textedit_delete_selection(ImGuiInputTextState *str,STB_TexteditState *state)

{
  int *piVar1;
  int iVar2;
  int n;
  int *piVar3;
  int iVar4;
  int where;
  int where_00;
  int *piVar5;
  
  iVar2 = str->CurLenW;
  piVar5 = &state->select_start;
  where_00 = state->select_start;
  iVar4 = state->select_end;
  piVar1 = &state->select_end;
  where = where_00;
  if (where_00 != iVar4) {
    if (iVar2 < where_00) {
      *piVar5 = iVar2;
      where_00 = iVar2;
    }
    if (iVar2 < iVar4) {
      *piVar1 = iVar2;
      iVar4 = iVar2;
    }
    where = iVar4;
    if (where_00 == iVar4) {
      state->cursor = where_00;
      where = where_00;
    }
  }
  if (iVar2 < state->cursor) {
    state->cursor = iVar2;
  }
  if (where_00 - where != 0) {
    if (where_00 < where) {
      stb_textedit_delete(str,state,where_00,where - where_00);
      piVar3 = piVar5;
      piVar5 = piVar1;
    }
    else {
      stb_textedit_delete(str,state,where,where_00 - where);
      piVar3 = piVar1;
    }
    iVar2 = *piVar3;
    *piVar5 = iVar2;
    state->cursor = iVar2;
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

static void stb_textedit_delete_selection(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   stb_textedit_clamp(str, state);
   if (STB_TEXT_HAS_SELECTION(state)) {
      if (state->select_start < state->select_end) {
         stb_textedit_delete(str, state, state->select_start, state->select_end - state->select_start);
         state->select_end = state->cursor = state->select_start;
      } else {
         stb_textedit_delete(str, state, state->select_end, state->select_start - state->select_end);
         state->select_start = state->cursor = state->select_end;
      }
      state->has_preferred_x = 0;
   }
}